

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O0

Constant * __thiscall
spvtools::opt::analysis::ConstantManager::GetDoubleConst(ConstantManager *this,double val)

{
  FloatProxy<double> type;
  IRContext *this_00;
  TypeManager *this_01;
  Constant *pCVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  Constant *c;
  FloatProxy<double> v;
  Type *float_type;
  double val_local;
  ConstantManager *this_local;
  
  this_00 = context(this);
  this_01 = IRContext::get_type_mgr(this_00);
  v.data_ = (uint_type)TypeManager::GetDoubleType(this_01);
  utils::FloatProxy<double>::FloatProxy((FloatProxy<double> *)&c,val);
  type.data_ = v.data_;
  utils::FloatProxy<double>::GetWords(&local_48,(FloatProxy<double> *)&c);
  pCVar1 = GetConstant(this,(Type *)type.data_,&local_48);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_48);
  return pCVar1;
}

Assistant:

const Constant* ConstantManager::GetDoubleConst(double val) {
  Type* float_type = context()->get_type_mgr()->GetDoubleType();
  utils::FloatProxy<double> v(val);
  const Constant* c = GetConstant(float_type, v.GetWords());
  return c;
}